

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O2

void __thiscall KDIS::KDataStream::Write<unsigned_short>(KDataStream *this,unsigned_short T)

{
  KUINT8 i;
  long lVar1;
  NetToDataType<unsigned_short> OctArray;
  uchar local_1b;
  NetToDataType<unsigned_short> local_1a;
  
  local_1a.m_Value = T;
  if (this->m_MachineEndian != this->m_NetEndian) {
    NetToDataType<unsigned_short>::SwapBytes(&local_1a);
  }
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    local_1b = *(uchar *)((long)&local_1a + lVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,&local_1b);
  }
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}